

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void build_node(XML_Parser parser,int src_node,XML_Content *dest,XML_Content **contpos,char **strpos
               )

{
  char cVar1;
  uint uVar2;
  int src_node_00;
  undefined8 uVar3;
  char *pcVar4;
  XML_Content *pXVar5;
  char *pcVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lStack_40;
  
  lVar9 = *(long *)((long)parser + 0x3a8);
  lVar10 = (long)src_node * 0x20;
  uVar3 = *(undefined8 *)(lVar9 + lVar10);
  dest->type = (int)uVar3;
  dest->quant = (int)((ulong)uVar3 >> 0x20);
  if ((int)uVar3 == 4) {
    dest->name = *strpos;
    pcVar6 = *(char **)(lVar9 + 8 + lVar10);
    do {
      cVar1 = *pcVar6;
      pcVar4 = *strpos;
      *strpos = pcVar4 + 1;
      *pcVar4 = cVar1;
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar1 != '\0');
    dest->numchildren = 0;
    lStack_40 = 0x18;
  }
  else {
    uVar2 = *(uint *)(lVar9 + 0x18 + lVar10);
    uVar7 = (ulong)uVar2;
    dest->numchildren = uVar2;
    pXVar5 = *contpos;
    dest->children = pXVar5;
    *contpos = pXVar5 + uVar7;
    piVar8 = (int *)(*(long *)((long)parser + 0x3a8) + lVar10 + 0x10);
    lVar9 = 0;
    for (uVar11 = 0; uVar11 < uVar7; uVar11 = uVar11 + 1) {
      src_node_00 = *piVar8;
      build_node(parser,src_node_00,(XML_Content *)((long)&dest->children->type + lVar9),contpos,
                 strpos);
      piVar8 = (int *)(*(long *)((long)parser + 0x3a8) + (long)src_node_00 * 0x20 + 0x1c);
      uVar7 = (ulong)dest->numchildren;
      lVar9 = lVar9 + 0x20;
    }
    lStack_40 = 8;
  }
  *(undefined8 *)((long)&dest->type + lStack_40) = 0;
  return;
}

Assistant:

static void
build_node (XML_Parser parser,
            int src_node,
            XML_Content *dest,
            XML_Content **contpos,
            char **strpos)
{
  dest->type = dtd.scaffold[src_node].type;
  dest->quant = dtd.scaffold[src_node].quant;
  if (dest->type == XML_CTYPE_NAME) {
    const char *src;
    dest->name = *strpos;
    src = dtd.scaffold[src_node].name;
    for (;;) {
      *(*strpos)++ = *src;
      if (! *src)
        break;
      src++;
    }
    dest->numchildren = 0;
    dest->children = 0;
  }
  else {
    unsigned int i;
    int cn;
    dest->numchildren = dtd.scaffold[src_node].childcnt;
    dest->children = *contpos;
    *contpos += dest->numchildren;
    for (i = 0, cn = dtd.scaffold[src_node].firstchild;
         i < dest->numchildren;
         i++, cn = dtd.scaffold[cn].nextsib) {
      build_node(parser, cn, &(dest->children[i]), contpos, strpos);
    }
    dest->name = 0;
  }
}